

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O0

bool HandlePackage(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  size_type sVar4;
  const_reference pvVar5;
  ostream *poVar6;
  ulong uVar7;
  char *content;
  char *hash_00;
  undefined1 local_518 [8];
  string hash;
  string *outDir;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  cmMakefile *local_4a0;
  cmMakefile *mf;
  undefined1 local_478 [8];
  ostringstream e_1;
  undefined1 local_300 [8];
  RegularExpression packageRegex;
  char *packageExpr;
  string local_220;
  undefined4 local_1fc;
  string local_1f8;
  undefined1 local_1d8 [8];
  ostringstream e;
  uint local_4c;
  undefined1 local_48 [4];
  uint i;
  string package;
  Doing doing;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  package.field_2._12_4_ = 1;
  std::__cxx11::string::string((string *)local_48);
  for (local_4c = 1;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), local_4c < sVar4; local_4c = local_4c + 1) {
    if (package.field_2._12_4_ != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      poVar6 = std::operator<<((ostream *)local_1d8,"PACKAGE given unknown argument: ");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)local_4c);
      std::operator<<(poVar6,(string *)pvVar5);
      std::__cxx11::ostringstream::str();
      cmExecutionStatus::SetError(status,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      args_local._7_1_ = false;
      local_1fc = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      goto LAB_0059aea2;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)local_4c);
    std::__cxx11::string::operator=((string *)local_48,(string *)pvVar5);
    package.field_2._12_4_ = 0;
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"PACKAGE must be given a package name.",
               (allocator<char> *)((long)&packageExpr + 7));
    cmExecutionStatus::SetError(status,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator((allocator<char> *)((long)&packageExpr + 7));
    args_local._7_1_ = false;
    local_1fc = 1;
    goto LAB_0059aea2;
  }
  packageRegex._200_8_ = anon_var_dwarf_a2978f;
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_300,"^[A-Za-z0-9_.-]+$");
  bVar2 = cmsys::RegularExpression::find((RegularExpression *)local_300,(string *)local_48);
  if (bVar2) {
    local_4a0 = cmExecutionStatus::GetMakefile(status);
    PVar3 = cmMakefile::GetPolicyStatus(local_4a0,CMP0090,false);
    pcVar1 = local_4a0;
    if ((PVar3 == OLD) || (PVar3 == WARN)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"CMAKE_EXPORT_NO_PACKAGE_REGISTRY",&local_4c1);
      bVar2 = cmMakefile::IsOn(pcVar1,&local_4c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator(&local_4c1);
      if (bVar2) {
        args_local._7_1_ = true;
        local_1fc = 1;
        goto LAB_0059ae86;
      }
    }
    else if (PVar3 - NEW < 3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e8,"CMAKE_EXPORT_PACKAGE_REGISTRY",
                 (allocator<char> *)((long)&outDir + 7));
      bVar2 = cmMakefile::IsOn(pcVar1,&local_4e8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&outDir + 7));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        args_local._7_1_ = true;
        local_1fc = 1;
        goto LAB_0059ae86;
      }
    }
    hash.field_2._8_8_ = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_4a0);
    cmSystemTools::ComputeStringMD5((string *)local_518,(string *)hash.field_2._8_8_);
    pcVar1 = local_4a0;
    content = (char *)std::__cxx11::string::c_str();
    hash_00 = (char *)std::__cxx11::string::c_str();
    StorePackageRegistry(pcVar1,(string *)local_48,content,hash_00);
    args_local._7_1_ = true;
    local_1fc = 1;
    std::__cxx11::string::~string((string *)local_518);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
    poVar6 = std::operator<<((ostream *)local_478,"PACKAGE given invalid package name \"");
    poVar6 = std::operator<<(poVar6,(string *)local_48);
    poVar6 = std::operator<<(poVar6,"\".  ");
    poVar6 = std::operator<<(poVar6,"Package names must match \"");
    poVar6 = std::operator<<(poVar6,(char *)packageRegex._200_8_);
    std::operator<<(poVar6,"\".");
    std::__cxx11::ostringstream::str();
    cmExecutionStatus::SetError(status,(string *)&mf);
    std::__cxx11::string::~string((string *)&mf);
    args_local._7_1_ = false;
    local_1fc = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
  }
LAB_0059ae86:
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_300);
LAB_0059aea2:
  std::__cxx11::string::~string((string *)local_48);
  return args_local._7_1_;
}

Assistant:

static bool HandlePackage(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  // Parse PACKAGE mode arguments.
  enum Doing
  {
    DoingNone,
    DoingPackage
  };
  Doing doing = DoingPackage;
  std::string package;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (doing == DoingPackage) {
      package = args[i];
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "PACKAGE given unknown argument: " << args[i];
      status.SetError(e.str());
      return false;
    }
  }

  // Verify the package name.
  if (package.empty()) {
    status.SetError("PACKAGE must be given a package name.");
    return false;
  }
  const char* packageExpr = "^[A-Za-z0-9_.-]+$";
  cmsys::RegularExpression packageRegex(packageExpr);
  if (!packageRegex.find(package)) {
    std::ostringstream e;
    e << "PACKAGE given invalid package name \"" << package << "\".  "
      << "Package names must match \"" << packageExpr << "\".";
    status.SetError(e.str());
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // CMP0090 decides both the default and what variable changes it.
  switch (mf.GetPolicyStatus(cmPolicies::CMP0090)) {
    case cmPolicies::WARN:
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // Default is to export, but can be disabled.
      if (mf.IsOn("CMAKE_EXPORT_NO_PACKAGE_REGISTRY")) {
        return true;
      }
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Default is to not export, but can be enabled.
      if (!mf.IsOn("CMAKE_EXPORT_PACKAGE_REGISTRY")) {
        return true;
      }
      break;
  }

  // We store the current build directory in the registry as a value
  // named by a hash of its own content.  This is deterministic and is
  // unique with high probability.
  const std::string& outDir = mf.GetCurrentBinaryDirectory();
  std::string hash = cmSystemTools::ComputeStringMD5(outDir);
  StorePackageRegistry(mf, package, outDir.c_str(), hash.c_str());

  return true;
}